

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

int __thiscall
flow::CastInstr::clone(CastInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined4 local_24;
  _Alloc_hider local_20;
  _func_int **local_18;
  
  local_24 = *(undefined4 *)(__fn + 8);
  local_20._M_p = (pointer)**(undefined8 **)(__fn + 0x50);
  std::make_unique<flow::CastInstr,flow::LiteralType,flow::Value*,std::__cxx11::string_const&>
            ((LiteralType *)&local_18,(Value **)&local_24,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20);
  (this->super_Instr).super_Value._vptr_Value = local_18;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> CastInstr::clone() {
  return std::make_unique<CastInstr>(type(), source(), name());
}